

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void simd::Flip(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,bool horizontal,bool vertical,
               SIMDType simdType)

{
  uint32_t startYOut_00;
  Image *in_RCX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  Image *in_RDI;
  uint32_t in_R8D;
  uint32_t in_R9D;
  uint32_t unaff_R12D;
  uint32_t unaff_R14D;
  uint32_t unaff_retaddr;
  uint in_stack_00000008;
  undefined4 in_stack_00000010;
  undefined1 in_stack_00000018;
  undefined1 uStack0000000000000020;
  SIMDType in_stack_00000028;
  uint32_t nonSimdWidth;
  uint32_t totalSimdWidth;
  uint32_t simdWidth;
  uint8_t *inYEnd;
  uint8_t *inY;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  uint32_t in_stack_000000b0;
  uint8_t *in_stack_000000b8;
  uint8_t *in_stack_000000c0;
  uint32_t simdSize;
  undefined4 in_stack_fffffffffffffeec;
  undefined8 in_stack_fffffffffffffef0;
  undefined4 uVar1;
  ImageTemplate<unsigned_char> *this;
  uint32_t in_stack_ffffffffffffff08;
  uint32_t in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  uint32_t in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  uint32_t in_stack_ffffffffffffff30;
  uint32_t in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint32_t in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  Image *in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff90;
  undefined2 uVar2;
  uint32_t in_stack_ffffffffffffff94;
  uint32_t in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  uint32_t in_stack_ffffffffffffffa0;
  uint32_t in_stack_ffffffffffffffa4;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  undefined3 in_stack_ffffffffffffffb4;
  uint uVar3;
  
  uVar1 = (undefined4)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  uVar3 = CONCAT13(in_stack_00000018,in_stack_ffffffffffffffb4) & 0x1ffffff;
  uVar3 = CONCAT13((char)(uVar3 >> 0x18),CONCAT12(uStack0000000000000020,(short)uVar3)) & 0xff01ffff
  ;
  startYOut_00 = getSimdSize(in_stack_00000028);
  if (in_stack_00000028 == neon_function) {
    startYOut_00 = 8;
  }
  if (((in_stack_00000028 == cpu_function) || (in_stack_00000028 == avx_function)) ||
     (in_stack_00000008 < startYOut_00)) {
    if (in_stack_00000028 == avx_function) {
      Flip((Image *)CONCAT44(in_ESI,in_EDX),(uint32_t)((ulong)in_RCX >> 0x20),(uint32_t)in_RCX,
           (Image *)CONCAT44(in_R8D,in_R9D),uVar3,startYOut_00,unaff_retaddr,in_stack_00000008,
           (bool)in_stack_ffffffffffffffaf,(bool)in_stack_ffffffffffffffae,_uStack0000000000000020);
    }
    else {
      Image_Function::Flip
                (in_RDI,in_ESI,in_EDX,in_RCX,in_R8D,in_R9D,unaff_R12D,unaff_R14D,
                 SUB41(uVar3 >> 0x18,0),SUB41(uVar3 >> 0x10,0));
    }
  }
  else {
    this = (ImageTemplate<unsigned_char> *)CONCAT44(uVar1,in_stack_00000010);
    Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
              ((ImageTemplate<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
               (ImageTemplate<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff38);
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              (this,(ImageTemplate<unsigned_char> *)
                    CONCAT44(in_stack_fffffffffffffeec,in_stack_00000008));
    Image_Function::
    VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
              (this,(ImageTemplate<unsigned_char> *)
                    CONCAT44(in_stack_fffffffffffffeec,in_stack_00000008));
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x136bb2);
    if (((uVar3 & 0x1000000) == 0) && ((uVar3 & 0x10000) == 0)) {
      Image_Function::Copy
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                 (Image *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                 (uint32_t)in_stack_ffffffffffffff68,in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff98);
    }
    else {
      PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
      uVar2 = (undefined2)(in_stack_ffffffffffffff90 >> 0x10);
      PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
      PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
      if (in_stack_00000028 == sse_function) {
        sse::Flip((Image *)CONCAT17(in_stack_ffffffffffffffaf,
                                    CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)),
                  in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                  in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_000000b0,
                  in_stack_000000b8,in_stack_000000c0,SUB21((ushort)uVar2 >> 8,0),SUB21(uVar2,0),
                  (uint32_t)out,startYIn,(uint32_t)in);
      }
    }
  }
  return;
}

Assistant:

void Flip( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
               uint32_t width, uint32_t height, bool horizontal, bool vertical, SIMDType simdType )
    {
        uint32_t simdSize = getSimdSize( simdType );

        if( simdType == neon_function ) // for neon, because the algorithm used work with packet of 64 bit
            simdSize = 8u;

        if( (simdType == cpu_function) || (simdType == avx_function) || (width < simdSize) ) {
            AVX_CODE( Flip( in, startXIn, startYIn, out, startXOut, startYOut, width, height, horizontal, vertical, sse_function ); )

            Image_Function::Flip( in, startXIn, startYIn, out, startXOut, startYOut, width, height, horizontal, vertical );
            return;
        }

        Image_Function::ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        Image_Function::VerifyGrayScaleImage( in, out );

        if( !horizontal && !vertical ) {
            Image_Function::Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        }
        else {
            const uint32_t rowSizeIn  = in.rowSize();
            const uint32_t rowSizeOut = out.rowSize();

            const uint8_t * inY    = in.data() + startYIn * rowSizeIn + startXIn;
            const uint8_t * inYEnd = inY + height * rowSizeIn;

            const uint32_t simdWidth = width / simdSize;
            const uint32_t totalSimdWidth = simdWidth * simdSize;
            const uint32_t nonSimdWidth = width - totalSimdWidth;

            SSSE3_CODE( sse::Flip( out, startXOut, startYOut, width, height, rowSizeIn, rowSizeOut, inY, inYEnd, horizontal, 
                                   vertical, simdWidth, totalSimdWidth, nonSimdWidth ); )
            NEON_CODE( neon::Flip( out, startXOut, startYOut, width, height, rowSizeIn, rowSizeOut, inY, inYEnd, horizontal, 
                                   vertical, simdWidth, totalSimdWidth, nonSimdWidth ); )
        }
    }